

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

void __thiscall
glslang::TSymbolTable::setPreviousDefaultPrecisions(TSymbolTable *this,TPrecisionQualifier *p)

{
  int iVar1;
  reference ppTVar2;
  TPrecisionQualifier *p_local;
  TSymbolTable *this_local;
  
  iVar1 = currentLevel(this);
  ppTVar2 = std::vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ::operator[](&this->table,(long)iVar1);
  TSymbolTableLevel::setPreviousDefaultPrecisions(*ppTVar2,p);
  return;
}

Assistant:

void setPreviousDefaultPrecisions(TPrecisionQualifier *p) { table[currentLevel()]->setPreviousDefaultPrecisions(p); }